

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O2

void Saig_TsiPrintTraces(Saig_Tsim_t *p,int nWords,int nPrefix,int nLoop)

{
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar2 = p->pAig->nRegs;
  puts("Ternary traces for each flop:");
  printf("      : ");
  for (uVar4 = 0; (int)uVar4 < p->vStates->nSize + ~nLoop; uVar4 = uVar4 + 1) {
    printf("%d",(ulong)uVar4 % 10);
  }
  printf("  ");
  if (nLoop < 1) {
    nLoop = 0;
  }
  uVar4 = 0;
  while( true ) {
    bVar5 = nLoop == 0;
    nLoop = nLoop + -1;
    if (bVar5) break;
    printf("%d",(ulong)uVar4 % 10);
    uVar4 = uVar4 + 1;
  }
  putchar(10);
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  uVar4 = 0;
  while( true ) {
    if (uVar4 == uVar2) {
      return;
    }
    printf("%5d : ",(ulong)uVar4);
    uVar3 = uVar4 * 2 & 0x1e;
    if (0 < p->vStates->nSize + -1) break;
    putchar(10);
    uVar4 = uVar4 + 1;
  }
  pvVar1 = Vec_PtrEntry(p->vStates,0);
  uVar2 = *(uint *)((long)pvVar1 + (ulong)(uVar4 >> 4) * 4);
  (*(code *)(&DAT_00856620 +
            *(int *)(&DAT_00856620 +
                    (ulong)((uint)((uVar2 >> uVar3 & 1) != 0) +
                           (uVar2 >> ((char)uVar3 + 1U & 0x1f) & 1) * 2) * 4)))(0x30);
  return;
}

Assistant:

void Saig_TsiPrintTraces( Saig_Tsim_t * p, int nWords, int nPrefix, int nLoop )
{
    unsigned * pState;
    int nRegs = p->pAig->nRegs;
    int Value, i, k, Counter = 0;
    printf( "Ternary traces for each flop:\n" );
    printf( "      : " );
    for ( i = 0; i < Vec_PtrSize(p->vStates) - nLoop - 1; i++ )
        printf( "%d", i%10 );
    printf( "  " );
    for ( i = 0; i < nLoop; i++ )
        printf( "%d", i%10 );
    printf( "\n" );
    for ( i = 0; i < nRegs; i++ )
    {
/*
        Vec_PtrForEachEntry( unsigned *, p->vStates, pState, k )
        {
            Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
            if ( Value == SAIG_XVSX )
                break;
        }
        if ( k == Vec_PtrSize(p->vStates) )
            Counter++;
        else
            continue;
*/

        // print trace
//        printf( "%5d : %5d %5d  ", Counter, i, Saig_ManLo(p->pAig, i)->Id );
        printf( "%5d : ", Counter++ );
        Vec_PtrForEachEntryStop( unsigned *, p->vStates, pState, k, Vec_PtrSize(p->vStates)-1 )
        {
            Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
            if ( Value == SAIG_XVS0 )
                printf( "0" );
            else if ( Value == SAIG_XVS1 )
                printf( "1" );
            else if ( Value == SAIG_XVSX )
                printf( "x" );
            else
                assert( 0 );
            if ( k == nPrefix - 1 )
                printf( "  " );
        }
        printf( "\n" );
    }
}